

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O2

void change_calls(gen_ctx_t gen_ctx,uint8_t *base)

{
  MIR_context_t ctx;
  VARR_call_ref_t *pVVar1;
  long lVar2;
  MIR_item_t pMVar3;
  int iVar4;
  size_t sVar5;
  call_ref_t *__ptr;
  uint64_t uVar6;
  long v;
  ulong uVar7;
  ulong ix;
  size_t sVar8;
  uint8_t rel_insn [6];
  const_ref_t cr;
  
  ctx = gen_ctx->ctx;
  ix = 0;
  do {
    sVar5 = VARR_const_ref_tlength(gen_ctx->target_ctx->const_refs);
    if (sVar5 <= ix) {
      return;
    }
    VARR_const_ref_tget(&cr,gen_ctx->target_ctx->const_refs,ix);
    sVar5 = cr.pc;
    pMVar3 = cr.func_item;
    if (cr.call_p != 0) {
      if (base[cr.pc - 2] != 0xff) {
        __assert_fail("base[cr.pc - 2] == 0xff",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0xb88,"void change_calls(gen_ctx_t, uint8_t *)");
      }
      if ((base[cr.pc - 1] != '\x15') && (base[cr.pc - 1] != '%')) {
        __assert_fail("base[cr.pc - 1] == 0x15 || base[cr.pc - 1] == 0x25",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0xb89,"void change_calls(gen_ctx_t, uint8_t *)");
      }
      lVar2 = cr.pc - 2;
      if (cr.func_item != (MIR_item_t)0x0) {
        iVar4 = MIR_get_func_redef_permission_p(gen_ctx->ctx);
        if (iVar4 == 0) {
          pVVar1 = gen_ctx->target_ctx->call_refs;
          __ptr = pVVar1->varr;
          if (__ptr == (call_ref_t *)0x0) {
            mir_varr_assert_fail("expand","call_ref_t");
          }
          sVar8 = pVVar1->els_num;
          uVar7 = sVar8 + 1;
          if (pVVar1->size < uVar7) {
            sVar8 = (uVar7 >> 1) + uVar7;
            __ptr = (call_ref_t *)realloc(__ptr,sVar8 * 0x10);
            pVVar1->varr = __ptr;
            pVVar1->size = sVar8;
            sVar8 = pVVar1->els_num;
            uVar7 = sVar8 + 1;
          }
          pVVar1->els_num = uVar7;
          __ptr[sVar8].ref_func_item = pMVar3;
          __ptr[sVar8].call_addr = base + lVar2;
        }
      }
      uVar6 = VARR_uint64_tget(gen_ctx->target_ctx->const_pool,cr.const_num);
      v = uVar6 - (long)(base + cr.next_insn_disp);
      if ((int)v == v) {
        rel_insn[4] = '\0';
        rel_insn[5] = '\0';
        rel_insn[0] = '@';
        rel_insn[1] = 0xe8;
        rel_insn[2] = '\0';
        rel_insn[3] = '\0';
        if (base[sVar5 - 1] == '%') {
          rel_insn[0] = '@';
          rel_insn[1] = 0xe9;
          rel_insn[2] = '\0';
          rel_insn[3] = '\0';
        }
        set_int64(rel_insn + 2,v,4);
        _MIR_change_code(ctx,base + lVar2,rel_insn,6);
      }
    }
    ix = ix + 1;
  } while( true );
}

Assistant:

static void change_calls (gen_ctx_t gen_ctx, uint8_t *base) {
  MIR_context_t ctx = gen_ctx->ctx;
  /* changing calls to rel32 calls: */
  for (size_t i = 0; i < VARR_LENGTH (const_ref_t, const_refs); i++) {
    const_ref_t cr = VARR_GET (const_ref_t, const_refs, i);
    if (!cr.call_p) continue;
    gen_assert (base[cr.pc - 2] == 0xff);
    gen_assert (base[cr.pc - 1] == 0x15 || base[cr.pc - 1] == 0x25);
    if (cr.func_item != NULL) store_call_ref (gen_ctx, cr.func_item, (uint8_t *) base + cr.pc - 2);
    uint64_t v = VARR_GET (uint64_t, const_pool, cr.const_num);
    int64_t off = (int64_t) v - (int64_t) (base + cr.next_insn_disp);
    if (!int32_p (off)) continue;
    uint8_t rel_insn[] = {0x40, 0xe8, 0, 0, 0, 0};   /* rex call rel32 */
    if (base[cr.pc - 1] == 0x25) rel_insn[1] = 0xe9; /* rex jmp rel32 */
    set_int64 (rel_insn + 2, off, 4);
    _MIR_change_code (ctx, (uint8_t *) base + cr.pc - 2, (uint8_t *) rel_insn, 6);
  }
}